

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::AsyncCapabilityStream> * __thiscall
kj::Own<kj::AsyncCapabilityStream>::operator=
          (Own<kj::AsyncCapabilityStream> *this,Own<kj::AsyncCapabilityStream> *other)

{
  AsyncCapabilityStream *object;
  Dispose_<kj::AsyncCapabilityStream,_true> *this_00;
  AsyncCapabilityStream *pAVar1;
  Disposer *in_RDX;
  
  object = (AsyncCapabilityStream *)this->disposer;
  this_00 = (Dispose_<kj::AsyncCapabilityStream,_true> *)this->ptr;
  pAVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pAVar1;
  other->ptr = (AsyncCapabilityStream *)0x0;
  if (this_00 != (Dispose_<kj::AsyncCapabilityStream,_true> *)0x0) {
    Disposer::Dispose_<kj::AsyncCapabilityStream,_true>::dispose(this_00,object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }